

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMacroCommand.cxx
# Opt level: O3

bool __thiscall
cmMacroHelperCommand::InvokeInitialPass
          (cmMacroHelperCommand *this,
          vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *args,
          cmExecutionStatus *inStatus)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmMacroHelperCommand *pcVar3;
  bool bVar4;
  pointer pbVar5;
  long *plVar6;
  long lVar7;
  cmExecutionStatus *pcVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  ulong uVar10;
  byte bVar11;
  ulong uVar12;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar13;
  pointer pcVar14;
  pointer pcVar15;
  pointer pcVar16;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  expandedArgs;
  cmExecutionStatus status;
  cmListFileFunction newLFF;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  variables;
  MacroPushPop macroScope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  argVs;
  string expandedArgv;
  string expandedArgn;
  string argcDef;
  char argvName [60];
  ostringstream argcDefStream;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_378;
  string local_360;
  cmExecutionStatus *local_340;
  cmMacroHelperCommand *local_338;
  cmListFileArgument local_330;
  pointer local_300;
  undefined1 local_2f8 [32];
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  long local_2b8;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> vStack_2b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_298;
  pointer local_280;
  MacroPushPop local_278;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  string local_248;
  string local_228;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_378.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmMakefile::ExpandArguments((this->super_cmCommand).Makefile,args,&local_378,(char *)0x0);
  if ((ulong)((long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) <
      ((long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
    local_1a8[0]._M_dataplus._M_p = (pointer)&local_1a8[0].field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"Macro invoked with incorrect arguments for macro named: ","");
    std::__cxx11::string::_M_append
              ((char *)local_1a8,
               (ulong)(((this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p);
    cmCommand::SetError(&this->super_cmCommand,local_1a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
      operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
    }
    bVar11 = 0;
  }
  else {
    cmMakefile::MacroPushPop::MacroPushPop
              (&local_278,(this->super_cmCommand).Makefile,&this->FilePath,&this->Policies);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__cxx11::stringbuf::str();
    local_2f8._0_8_ =
         (long)local_378.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start +
         (long)(this->Args).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
         (-0x20 - (long)(this->Args).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    local_2f8._8_8_ =
         local_378.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    cmJoin<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
              (&local_228,
               (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *)local_2f8,";");
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (&local_248,&local_378,";");
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_298.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_340 = inStatus;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_298,
              ((long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->Args).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5) - 1);
    pbVar5 = (this->Args).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_338 = this;
    if (0x20 < (ulong)((long)(this->Args).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
      uVar10 = 1;
      uVar12 = 2;
      do {
        std::operator+(local_1e8,"${",pbVar5 + uVar10);
        plVar6 = (long *)std::__cxx11::string::append((char *)local_1e8);
        local_2f8._0_8_ = local_2f8 + 0x10;
        pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar6 + 2);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6 == pbVar9)
        {
          local_2f8._16_8_ = (pbVar9->_M_dataplus)._M_p;
          local_2f8._24_8_ = plVar6[3];
        }
        else {
          local_2f8._16_8_ = (pbVar9->_M_dataplus)._M_p;
          local_2f8._0_8_ =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar6;
        }
        local_2f8._8_8_ = plVar6[1];
        *plVar6 = (long)pbVar9;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_298,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8);
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f8 + 0x10))
        {
          operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8[0]._M_dataplus._M_p != &local_1e8[0].field_2) {
          operator_delete(local_1e8[0]._M_dataplus._M_p,
                          local_1e8[0].field_2._M_allocated_capacity + 1);
        }
        pbVar5 = (local_338->Args).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        bVar4 = uVar12 < (ulong)((long)(local_338->Args).
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >>
                                5);
        uVar10 = uVar12;
        uVar12 = (ulong)((int)uVar12 + 1);
      } while (bVar4);
    }
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_268.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_268,
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_378.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
    pcVar3 = local_338;
    if (local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_378.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar10 = 0;
      do {
        sprintf((char *)local_1e8,"${ARGV%u}",uVar10);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char(&)[60]>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_268,
                   (char (*) [60])local_1e8);
        uVar10 = (ulong)((int)uVar10 + 1);
      } while (uVar10 < (ulong)((long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_378.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    local_2d8._M_p = (pointer)&local_2c8;
    local_2f8._0_8_ = local_2f8 + 0x10;
    local_2f8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_2f8._16_8_ = local_2f8._16_8_ & 0xffffffffffffff00;
    local_2d0 = 0;
    local_2c8._M_local_buf[0] = '\0';
    local_2b8 = 0;
    vStack_2b0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vStack_2b0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    vStack_2b0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar16 = (pcVar3->Functions).
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
              super__Vector_impl_data._M_start;
    local_280 = (pcVar3->Functions).
                super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>._M_impl.
                super__Vector_impl_data._M_finish;
    if (pcVar16 == local_280) {
      bVar11 = 1;
    }
    else {
      paVar1 = &local_360.field_2;
      do {
        pcVar2 = vStack_2b0.
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        pcVar15 = vStack_2b0.
                  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        local_300 = pcVar16;
        if (vStack_2b0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
            _M_impl.super__Vector_impl_data._M_finish !=
            vStack_2b0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          paVar13 = &((vStack_2b0.
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start)->Value).field_2;
          do {
            plVar6 = (long *)(((string *)(paVar13 + -1))->_M_dataplus)._M_p;
            if (paVar13 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar6) {
              operator_delete(plVar6,paVar13->_M_allocated_capacity + 1);
            }
            pcVar14 = (pointer)(paVar13 + 2);
            paVar13 = paVar13 + 3;
          } while (pcVar14 != pcVar2);
          vStack_2b0.super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
          _M_impl.super__Vector_impl_data._M_finish = pcVar15;
        }
        pcVar16 = local_300;
        std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::reserve
                  (&vStack_2b0,
                   ((long)(local_300->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(local_300->Arguments).
                          super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) * -0x5555555555555555);
        std::__cxx11::string::_M_assign((string *)local_2f8);
        std::__cxx11::string::_M_assign((string *)(local_2f8 + 0x20));
        local_2b8 = (pcVar16->super_cmCommandContext).Line;
        pcVar2 = (pcVar16->Arguments).
                 super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pcVar15 = (pcVar16->Arguments).
                       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
                       _M_impl.super__Vector_impl_data._M_start; pcVar15 != pcVar2;
            pcVar15 = pcVar15 + 1) {
          local_330.Value._M_dataplus._M_p = (pointer)&local_330.Value.field_2;
          local_330.Value._M_string_length = 0;
          local_330.Value.field_2._M_local_buf[0] = '\0';
          local_330.Delim = Unquoted;
          local_330.Line = 0;
          std::__cxx11::string::_M_assign((string *)&local_330);
          if (pcVar15->Delim != Bracket) {
            if (local_298.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_298.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) {
              uVar10 = 0;
              uVar12 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_330.Value,
                           local_298.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar10,
                           local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar10);
                bVar4 = uVar12 < (ulong)((long)local_298.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_298.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar10 = uVar12;
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (bVar4);
            }
            local_360._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"${ARGC}","");
            cmsys::SystemTools::ReplaceString(&local_330.Value,&local_360,&local_208);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != paVar1) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            local_360._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"${ARGN}","");
            cmsys::SystemTools::ReplaceString(&local_330.Value,&local_360,&local_228);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != paVar1) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            local_360._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"${ARGV}","");
            cmsys::SystemTools::ReplaceString(&local_330.Value,&local_360,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p != paVar1) {
              operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1
                             );
            }
            lVar7 = std::__cxx11::string::find((char *)&local_330,0x4b3639,0);
            if ((lVar7 != -1) &&
               (local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish !=
                local_378.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)) {
              uVar10 = 0;
              uVar12 = 1;
              do {
                cmsys::SystemTools::ReplaceString
                          (&local_330.Value,
                           local_268.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar10,
                           local_378.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar10);
                bVar4 = uVar12 < (ulong)((long)local_378.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)local_378.
                                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 5);
                uVar10 = uVar12;
                uVar12 = (ulong)((int)uVar12 + 1);
              } while (bVar4);
            }
          }
          local_330.Delim = pcVar15->Delim;
          local_330.Line = pcVar15->Line;
          std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::
          emplace_back<cmListFileArgument>(&vStack_2b0,&local_330);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_330.Value._M_dataplus._M_p != &local_330.Value.field_2) {
            operator_delete(local_330.Value._M_dataplus._M_p,
                            CONCAT71(local_330.Value.field_2._M_allocated_capacity._1_7_,
                                     local_330.Value.field_2._M_local_buf[0]) + 1);
          }
        }
        local_330.Value._M_dataplus._M_p = local_330.Value._M_dataplus._M_p & 0xffffffff00000000;
        bVar4 = cmMakefile::ExecuteCommand
                          ((local_338->super_cmCommand).Makefile,(cmListFileFunction *)local_2f8,
                           (cmExecutionStatus *)&local_330);
        if ((!bVar4) || (local_330.Value._M_dataplus._M_p._3_1_ == '\x01')) {
          local_278.ReportError = false;
          pcVar16 = (pointer)0x0;
          pcVar8 = (cmExecutionStatus *)&local_340->NestedError;
LAB_00210b3e:
          pcVar8->ReturnInvoked = true;
          bVar11 = 0;
          goto LAB_00210b53;
        }
        pcVar16 = (pointer)0x1;
        pcVar8 = local_340;
        if ((char)local_330.Value._M_dataplus._M_p != '\0') goto LAB_00210b3e;
        if (local_330.Value._M_dataplus._M_p._1_1_ == '\x01') {
          pcVar8 = (cmExecutionStatus *)&local_340->BreakInvoked;
          goto LAB_00210b3e;
        }
        pcVar16 = local_300 + 1;
      } while (pcVar16 != local_280);
      bVar11 = 1;
    }
LAB_00210b53:
    std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(&vStack_2b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d8._M_p != &local_2c8) {
      operator_delete(local_2d8._M_p,
                      CONCAT71(local_2c8._M_allocated_capacity._1_7_,local_2c8._M_local_buf[0]) + 1)
      ;
    }
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2f8._0_8_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_2f8 + 0x10)) {
      operator_delete((void *)local_2f8._0_8_,(ulong)(local_2f8._16_8_ + 1));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_268);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_298);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != &local_228.field_2) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_dataplus._M_p != &local_208.field_2) {
      operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
    }
    bVar11 = bVar11 | (byte)pcVar16;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    cmMakefile::MacroPushPop::~MacroPushPop(&local_278);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_378);
  return (bool)(bVar11 & 1);
}

Assistant:

bool cmMacroHelperCommand::InvokeInitialPass(
  const std::vector<cmListFileArgument>& args, cmExecutionStatus& inStatus)
{
  // Expand the argument list to the macro.
  std::vector<std::string> expandedArgs;
  this->Makefile->ExpandArguments(args, expandedArgs);

  // make sure the number of arguments passed is at least the number
  // required by the signature
  if (expandedArgs.size() < this->Args.size() - 1) {
    std::string errorMsg =
      "Macro invoked with incorrect arguments for macro named: ";
    errorMsg += this->Args[0];
    this->SetError(errorMsg);
    return false;
  }

  cmMakefile::MacroPushPop macroScope(this->Makefile, this->FilePath,
                                      this->Policies);

  // set the value of argc
  std::ostringstream argcDefStream;
  argcDefStream << expandedArgs.size();
  std::string argcDef = argcDefStream.str();

  std::vector<std::string>::const_iterator eit =
    expandedArgs.begin() + (this->Args.size() - 1);
  std::string expandedArgn = cmJoin(cmMakeRange(eit, expandedArgs.end()), ";");
  std::string expandedArgv = cmJoin(expandedArgs, ";");
  std::vector<std::string> variables;
  variables.reserve(this->Args.size() - 1);
  for (unsigned int j = 1; j < this->Args.size(); ++j) {
    variables.push_back("${" + this->Args[j] + "}");
  }
  std::vector<std::string> argVs;
  argVs.reserve(expandedArgs.size());
  char argvName[60];
  for (unsigned int j = 0; j < expandedArgs.size(); ++j) {
    sprintf(argvName, "${ARGV%u}", j);
    argVs.emplace_back(argvName);
  }
  // Invoke all the functions that were collected in the block.
  cmListFileFunction newLFF;
  // for each function
  for (cmListFileFunction const& func : this->Functions) {
    // Replace the formal arguments and then invoke the command.
    newLFF.Arguments.clear();
    newLFF.Arguments.reserve(func.Arguments.size());
    newLFF.Name = func.Name;
    newLFF.Line = func.Line;

    // for each argument of the current function
    for (cmListFileArgument const& k : func.Arguments) {
      cmListFileArgument arg;
      arg.Value = k.Value;
      if (k.Delim != cmListFileArgument::Bracket) {
        // replace formal arguments
        for (unsigned int j = 0; j < variables.size(); ++j) {
          cmSystemTools::ReplaceString(arg.Value, variables[j],
                                       expandedArgs[j]);
        }
        // replace argc
        cmSystemTools::ReplaceString(arg.Value, "${ARGC}", argcDef);

        cmSystemTools::ReplaceString(arg.Value, "${ARGN}", expandedArgn);
        cmSystemTools::ReplaceString(arg.Value, "${ARGV}", expandedArgv);

        // if the current argument of the current function has ${ARGV in it
        // then try replacing ARGV values
        if (arg.Value.find("${ARGV") != std::string::npos) {
          for (unsigned int t = 0; t < expandedArgs.size(); ++t) {
            cmSystemTools::ReplaceString(arg.Value, argVs[t], expandedArgs[t]);
          }
        }
      }
      arg.Delim = k.Delim;
      arg.Line = k.Line;
      newLFF.Arguments.push_back(std::move(arg));
    }
    cmExecutionStatus status;
    if (!this->Makefile->ExecuteCommand(newLFF, status) ||
        status.GetNestedError()) {
      // The error message should have already included the call stack
      // so we do not need to report an error here.
      macroScope.Quiet();
      inStatus.SetNestedError();
      return false;
    }
    if (status.GetReturnInvoked()) {
      inStatus.SetReturnInvoked();
      return true;
    }
    if (status.GetBreakInvoked()) {
      inStatus.SetBreakInvoked();
      return true;
    }
  }
  return true;
}